

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FboCases::SharedColorbufferClearsTest::render
          (SharedColorbufferClearsTest *this,Context *context,Surface *dst)

{
  DataType type;
  deUint32 dVar1;
  uint uVar2;
  uint uVar3;
  DataTypes *samplerTypes;
  FboIncompleteException *this_00;
  int fbo;
  ulong uVar4;
  TextureFormat colorFormat;
  _Vector_base<glu::DataType,_std::allocator<glu::DataType>_> local_208;
  Vector<float,_4> local_1e8;
  Vector<float,_4> local_1d8;
  Texture2DShader shader;
  
  colorFormat = glu::mapGLInternalFormat((this->super_FboRenderCase).m_config.colorFormat);
  type = glu::getSampler2DType(colorFormat);
  checkColorFormatSupport(context,(this->super_FboRenderCase).m_config.colorFormat);
  if ((this->super_FboRenderCase).m_config.colorType == 0xde1) {
    (*context->_vptr_Context[6])(context,0xde1,1);
    (*context->_vptr_Context[0x7e])
              (context,0xde1,0,(ulong)(this->super_FboRenderCase).m_config.colorFormat,0x80,0x80);
    (*context->_vptr_Context[0x1d])(context,0xde1,0x2801,0x2600);
    (*context->_vptr_Context[0x1d])(context,0xde1,0x2800,0x2600);
  }
  else {
    (*context->_vptr_Context[0xc])(context,0x8d41,1);
    (*context->_vptr_Context[0x23])
              (context,0x8d41,(ulong)(this->super_FboRenderCase).m_config.colorFormat,0x80,0x80);
  }
  uVar4 = 1;
  while( true ) {
    if ((int)uVar4 == 4) break;
    (*context->_vptr_Context[9])(context,0x8d40,uVar4);
    if ((this->super_FboRenderCase).m_config.colorType == 0xde1) {
      (*context->_vptr_Context[0x1e])(context,0x8d40,0x8ce0,0xde1,1,0);
    }
    else {
      (*context->_vptr_Context[0x20])(context,0x8d40,0x8ce0,0x8d41,1);
    }
    uVar4 = (ulong)((int)uVar4 + 1);
  }
  (*context->_vptr_Context[9])(context,0x8d40,1);
  dVar1 = (*context->_vptr_Context[0x21])(context,0x8d40);
  if (dVar1 == 0x8cd5) {
    (*context->_vptr_Context[5])(context,0,0,0x80,0x80);
    (*context->_vptr_Context[0x2a])(0,0,0x3f800000,0x3f800000,context);
    (*context->_vptr_Context[0x2d])(context,0x4000);
    (*context->_vptr_Context[0x33])(context,0xc11);
    (*context->_vptr_Context[9])(context,0x8d40,2);
    (*context->_vptr_Context[0x2a])(0x3f19999a,0,0,0x3f800000,context);
    (*context->_vptr_Context[0x32])(context,10,10,0x40,0x40);
    (*context->_vptr_Context[0x2d])(context,0x4000);
    (*context->_vptr_Context[0x2a])(0,0x3f19999a,0,0x3f800000,context);
    (*context->_vptr_Context[0x32])(context,0x3c,0x3c,0x28,0x14);
    (*context->_vptr_Context[0x2d])(context,0x4000);
    (*context->_vptr_Context[9])(context,0x8d40,3);
    (*context->_vptr_Context[0x2a])(0,0,0x3f19999a,0x3f800000,context);
    (*context->_vptr_Context[0x32])(context,0x14,0x14,100,10);
    (*context->_vptr_Context[0x2d])(context,0x4000);
    (*context->_vptr_Context[9])(context,0x8d40,1);
    (*context->_vptr_Context[0x2a])(0x3f19999a,0,0x3f19999a,0x3f800000,context);
    (*context->_vptr_Context[0x32])(context,0x14,0x14,5,100);
    (*context->_vptr_Context[0x2d])(context,0x4000);
    (*context->_vptr_Context[0x34])(context,0xc11);
    if ((this->super_FboRenderCase).m_config.colorType == 0xde1) {
      local_208._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_208._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_208._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      samplerTypes = FboTestUtil::DataTypes::operator<<((DataTypes *)&local_208,type);
      tcu::Vector<float,_4>::Vector(&local_1e8,1.0);
      tcu::Vector<float,_4>::Vector(&local_1d8,0.0);
      FboTestUtil::Texture2DShader::Texture2DShader
                (&shader,samplerTypes,TYPE_FLOAT_VEC4,&local_1e8,&local_1d8);
      std::_Vector_base<glu::DataType,_std::allocator<glu::DataType>_>::~_Vector_base(&local_208);
      dVar1 = (*context->_vptr_Context[0x75])(context,&shader);
      FboTestUtil::Texture2DShader::setUniforms(&shader,context,dVar1);
      (*context->_vptr_Context[9])(context,0x8d40,0);
      uVar2 = (*context->_vptr_Context[2])(context);
      uVar3 = (*context->_vptr_Context[3])(context);
      (*context->_vptr_Context[5])(context,0,0,(ulong)uVar2,(ulong)uVar3);
      local_208._M_impl.super__Vector_impl_data._M_start = (pointer)0xbf666666bf666666;
      local_208._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)local_208._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000
                    );
      local_1e8.m_data[0] = 0.9;
      local_1e8.m_data[1] = 0.9;
      local_1e8.m_data[2] = 0.0;
      sglr::drawQuad(context,dVar1,(Vec3 *)&local_208,(Vec3 *)&local_1e8);
      uVar2 = (*context->_vptr_Context[2])(context);
      uVar3 = (*context->_vptr_Context[3])(context);
      (*context->_vptr_Context[0x80])(context,dst,0,0,(ulong)uVar2,(ulong)uVar3);
      FboTestUtil::Texture2DShader::~Texture2DShader(&shader);
    }
    else {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&shader,1.0);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_208,0.0);
      FboTestUtil::readPixels
                (context,dst,0,0,0x80,0x80,&colorFormat,(Vec4 *)&shader,(Vec4 *)&local_208);
    }
    return;
  }
  this_00 = (FboIncompleteException *)__cxa_allocate_exception(0x38);
  FboTestUtil::FboIncompleteException::FboIncompleteException
            (this_00,dVar1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboRenderTest.cpp"
             ,0x317);
  __cxa_throw(this_00,&FboTestUtil::FboIncompleteException::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SharedColorbufferClearsTest::render (sglr::Context& context, Surface& dst)
{
	tcu::TextureFormat		colorFormat		= glu::mapGLInternalFormat(m_config.colorFormat);
	glu::DataType			fboSamplerType	= glu::getSampler2DType(colorFormat);
	int						width			= 128;
	int						height			= 128;
	deUint32				colorbuffer		= 1;

	// Check for format support.
	checkColorFormatSupport(context, m_config.colorFormat);

	// Single colorbuffer
	if (m_config.colorType == GL_TEXTURE_2D)
	{
		context.bindTexture(GL_TEXTURE_2D, colorbuffer);
		context.texImage2D(GL_TEXTURE_2D, 0, m_config.colorFormat, width, height);
		context.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		context.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	}
	else
	{
		DE_ASSERT(m_config.colorType == GL_RENDERBUFFER);
		context.bindRenderbuffer(GL_RENDERBUFFER, colorbuffer);
		context.renderbufferStorage(GL_RENDERBUFFER, m_config.colorFormat, width, height);
	}

	// Multiple framebuffers sharing the colorbuffer
	for (int fbo = 1; fbo <= 3; fbo++)
	{
		context.bindFramebuffer(GL_FRAMEBUFFER, fbo);

		if (m_config.colorType == GL_TEXTURE_2D)
			context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, colorbuffer, 0);
		else
			context.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorbuffer);
	}

	context.bindFramebuffer(GL_FRAMEBUFFER, 1);

	// Check completeness
	{
		GLenum status = context.checkFramebufferStatus(GL_FRAMEBUFFER);
		if (status != GL_FRAMEBUFFER_COMPLETE)
			throw FboIncompleteException(status, __FILE__, __LINE__);
	}

	// Render to them
	context.viewport(0, 0, width, height);
	context.clearColor(0.0f, 0.0f, 1.0f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT);

	context.enable(GL_SCISSOR_TEST);

	context.bindFramebuffer(GL_FRAMEBUFFER, 2);
	context.clearColor(0.6f, 0.0f, 0.0f, 1.0f);
	context.scissor(10, 10, 64, 64);
	context.clear(GL_COLOR_BUFFER_BIT);
	context.clearColor(0.0f, 0.6f, 0.0f, 1.0f);
	context.scissor(60, 60, 40, 20);
	context.clear(GL_COLOR_BUFFER_BIT);

	context.bindFramebuffer(GL_FRAMEBUFFER, 3);
	context.clearColor(0.0f, 0.0f, 0.6f, 1.0f);
	context.scissor(20, 20, 100, 10);
	context.clear(GL_COLOR_BUFFER_BIT);

	context.bindFramebuffer(GL_FRAMEBUFFER, 1);
	context.clearColor(0.6f, 0.0f, 0.6f, 1.0f);
	context.scissor(20, 20, 5, 100);
	context.clear(GL_COLOR_BUFFER_BIT);

	context.disable(GL_SCISSOR_TEST);

	if (m_config.colorType == GL_TEXTURE_2D)
	{
		Texture2DShader shader(DataTypes() << fboSamplerType, glu::TYPE_FLOAT_VEC4);
		deUint32 shaderID = context.createProgram(&shader);

		shader.setUniforms(context, shaderID);

		context.bindFramebuffer(GL_FRAMEBUFFER, 0);
		context.viewport(0, 0, context.getWidth(), context.getHeight());
		sglr::drawQuad(context, shaderID, Vec3(-0.9f, -0.9f, 0.0f), Vec3(0.9f, 0.9f, 0.0f));
		context.readPixels(dst, 0, 0, context.getWidth(), context.getHeight());
	}
	else
		readPixels(context, dst, 0, 0, width, height, colorFormat, Vec4(1.0f), Vec4(0.0f));
}